

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateFunctionCall(ExpressionTranslateContext *ctx,ExprFunctionCall *expression)

{
  ExprBase *pEVar1;
  undefined8 *puVar2;
  bool bVar3;
  ExprBase *pEVar4;
  ExprBase **ppEVar5;
  char *format;
  TypeBase *pTVar6;
  
  pEVar1 = expression->function;
  if ((pEVar1 == (ExprBase *)0x0) || (pEVar4 = pEVar1, pEVar1->typeID != 0x26)) {
    pEVar4 = (ExprBase *)0x0;
  }
  if (pEVar4 == (ExprBase *)0x0) {
    pTVar6 = pEVar1->type;
    if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x15)) {
      pTVar6 = (TypeBase *)0x0;
    }
    if (pTVar6 == (TypeBase *)0x0) {
      __assert_fail("!\"unknwon type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x63b,
                    "void TranslateFunctionCall(ExpressionTranslateContext &, ExprFunctionCall *)");
    }
    Print(ctx,"((");
    TranslateTypeName(ctx,(TypeBase *)pTVar6[1]._vptr_TypeBase);
    Print(ctx,"(*)(");
    for (puVar2 = *(undefined8 **)&pTVar6[1].typeID; puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)puVar2[1]) {
      TranslateTypeName(ctx,(TypeBase *)*puVar2);
      Print(ctx,", ");
    }
    Print(ctx,"void*))(*__nullcFM)[(");
    Translate(ctx,expression->function);
    Print(ctx,").id])(");
    for (pEVar1 = (expression->arguments).head; pEVar1 != (ExprBase *)0x0; pEVar1 = pEVar1->next) {
      Translate(ctx,pEVar1);
      Print(ctx,", ");
    }
    ppEVar5 = &expression->function;
    Print(ctx,"(");
    format = ").context)";
  }
  else {
    TranslateFunctionName(ctx,(FunctionData *)pEVar4[1]._vptr_ExprBase);
    bVar3 = UseNonStaticTemplate(ctx,(FunctionData *)pEVar4[1]._vptr_ExprBase);
    if (bVar3) {
      Print(ctx,"<0>");
    }
    Print(ctx,"(");
    for (pEVar1 = (expression->arguments).head; pEVar1 != (ExprBase *)0x0; pEVar1 = pEVar1->next) {
      Translate(ctx,pEVar1);
      Print(ctx,", ");
    }
    ppEVar5 = (ExprBase **)&pEVar4[1].typeID;
    format = ")";
  }
  Translate(ctx,*ppEVar5);
  Print(ctx,format);
  return;
}

Assistant:

void TranslateFunctionCall(ExpressionTranslateContext &ctx, ExprFunctionCall *expression)
{
	if(ExprFunctionAccess *functionAccess = getType<ExprFunctionAccess>(expression->function))
	{
		TranslateFunctionName(ctx, functionAccess->function);

		if(UseNonStaticTemplate(ctx, functionAccess->function))
			Print(ctx, "<0>");

		Print(ctx, "(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Translate(ctx, functionAccess->context);

		Print(ctx, ")");
	}
	else if(TypeFunction *typeFunction = getType<TypeFunction>(expression->function->type))
	{
		// TODO: side effects may be performed multiple times since the node is translated two times
		Print(ctx, "((");
		TranslateTypeName(ctx, typeFunction->returnType);
		Print(ctx, "(*)(");

		for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
		{
			TranslateTypeName(ctx, curr->type);

			Print(ctx, ", ");
		}

		Print(ctx, "void*))(*__nullcFM)[(");
		Translate(ctx, expression->function);
		Print(ctx, ").id])(");

		for(ExprBase *value = expression->arguments.head; value; value = value->next)
		{
			Translate(ctx, value);

			Print(ctx, ", ");
		}

		Print(ctx, "(");
		Translate(ctx, expression->function);
		Print(ctx, ").context)");
	}
	else
	{
		assert(!"unknwon type");
	}
}